

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MeshDenoisingViaL0Minimization.cpp
# Opt level: O2

void __thiscall
MeshDenoisingViaL0Minimization::getInitialVerticesMatrix
          (MeshDenoisingViaL0Minimization *this,TriMesh *noisy_mesh,
          MatrixXd *initial_vertices_matrix)

{
  double dVar1;
  double dVar2;
  int iVar3;
  Point *pPVar4;
  Scalar *pSVar5;
  long row;
  VertexIter VVar6;
  undefined1 local_58 [8];
  VertexIter v_it;
  
  iVar3 = (**(code **)(*(long *)&(noisy_mesh->super_Mesh).
                                 super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                                 .
                                 super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                      + 0x10))(noisy_mesh);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::resize
            (&initial_vertices_matrix->
              super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,(long)iVar3,3);
  _local_58 = OpenMesh::PolyConnectivity::vertices_begin((PolyConnectivity *)noisy_mesh);
  while( true ) {
    VVar6 = OpenMesh::PolyConnectivity::vertices_end((PolyConnectivity *)noisy_mesh);
    if ((BaseHandle)v_it.mesh_._0_4_ == VVar6.hnd_.super_BaseHandle.idx_.super_BaseHandle &&
        local_58 == (undefined1  [8])VVar6.mesh_) break;
    row = (long)v_it.mesh_._0_4_;
    pPVar4 = OpenMesh::
             AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>::
             point((AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                    *)noisy_mesh,(VertexHandle)v_it.mesh_._0_4_);
    dVar1 = (pPVar4->super_VectorDataT<double,_3>).values_[0];
    dVar2 = (pPVar4->super_VectorDataT<double,_3>).values_[1];
    v_it._8_8_ = (pPVar4->super_VectorDataT<double,_3>).values_[2];
    pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                        initial_vertices_matrix,row,0);
    *pSVar5 = dVar1;
    pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                        initial_vertices_matrix,row,1);
    *pSVar5 = dVar2;
    pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                        initial_vertices_matrix,row,2);
    *pSVar5 = (Scalar)v_it._8_8_;
    OpenMesh::Iterators::
    GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_vertex_status,_&OpenMesh::ArrayKernel::n_vertices>
    ::operator++((GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_vertex_status,_&OpenMesh::ArrayKernel::n_vertices>
                  *)local_58,0);
  }
  return;
}

Assistant:

void MeshDenoisingViaL0Minimization::getInitialVerticesMatrix(TriMesh &noisy_mesh, Eigen::MatrixXd &initial_vertices_matrix)
{
    initial_vertices_matrix.resize((int)noisy_mesh.n_vertices(), 3);

    for(TriMesh::VertexIter v_it = noisy_mesh.vertices_begin(); v_it != noisy_mesh.vertices_end(); v_it++)
    {
        int index = v_it->idx();
        TriMesh::Point p = noisy_mesh.point(*v_it);
        initial_vertices_matrix(index, 0) = p[0];
        initial_vertices_matrix(index, 1) = p[1];
        initial_vertices_matrix(index, 2) = p[2];
    }
}